

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

string * __thiscall LogEvent::handleEvent_abi_cxx11_(string *__return_storage_ptr__,LogEvent *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  time_t tVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Level in_EDX;
  allocator local_881;
  tm *local_880;
  tm *timeStruct;
  string level;
  char timeString [64];
  char str [2048];
  LogEvent *this_local;
  
  LogLevel::ToString_abi_cxx11_((string *)&timeStruct,(LogLevel *)(ulong)this->m_level,in_EDX);
  local_880 = gmtime(&this->m_time);
  local_880->tm_hour = local_880->tm_hour + 8;
  strftime(level.field_2._M_local_buf + 8,0x40,"[%Y-%m-%d] [%H:%M:%S]",local_880);
  tVar3 = this->m_time;
  uVar4 = std::__cxx11::string::data();
  uVar1 = this->m_threadId;
  uVar5 = std::__cxx11::string::data();
  uVar2 = this->m_line;
  uVar6 = std::__cxx11::string::data();
  snprintf(timeString + 0x38,0x800,"[%lu] %s [%s] [%u] [%s] [%u] [%s]\r\n",tVar3,
           level.field_2._M_local_buf + 8,uVar4,uVar1,uVar5,uVar2,uVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,timeString + 0x38,&local_881);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  std::__cxx11::string::~string((string *)&timeStruct);
  return __return_storage_ptr__;
}

Assistant:

std::string LogEvent::handleEvent()
{
	char str[MAXSIZE],timeString[64];
	std::string level=LogLevel::ToString(m_level);
	struct tm* timeStruct=gmtime(&m_time);
	timeStruct->tm_hour+=8;
	strftime(timeString,64,"[%Y-%m-%d] [%H:%M:%S]",timeStruct);
	snprintf(str,MAXSIZE,"[%lu] %s [%s] [%u] [%s] [%u] [%s]\r\n",m_time,timeString,level.data(),m_threadId,m_funName.data(),m_line,m_content.data());
	return std::string(str);
}